

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

void __thiscall implementations::scheme::SchemeFrame::nextArgument(SchemeFrame *this)

{
  bool bVar1;
  cell *value;
  
  value = (this->arg_it)._M_current;
  while( true ) {
    if (value == (this->arguments).
                 super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      dispatch(this);
      return;
    }
    bVar1 = resolveArgument(this,value);
    if (!bVar1) break;
    value = (this->arg_it)._M_current + 1;
    (this->arg_it)._M_current = value;
  }
  return;
}

Assistant:

void nextArgument() {
		if (arg_it == arguments.cend())
			dispatch();
		else if (resolveArgument(*arg_it)) {
			++arg_it;
			nextArgument();
		}
	}